

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O2

void suprsrv(supcxdef *sup,_func_void_bifcxdef_ptr_int **bif,toktdef *tab,int max,int v1compat,
            char *new_do,int casefold)

{
  int iVar1;
  _func_void_bifcxdef_ptr_int *p_Var2;
  _func_void_toktdef_ptr_char_ptr_int_int_int_int *p_Var3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  supbidef *psVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  char *__src;
  char *pcVar11;
  supprdef *psVar12;
  char buf [40];
  
  uVar10 = 0;
  uVar8 = (ulong)(uint)max;
  if (max < 1) {
    uVar8 = uVar10;
  }
  for (psVar7 = supbitab; psVar7->supbinam != (char *)0x0; psVar7 = psVar7 + 1) {
    if (uVar8 == uVar10) {
      errsigf(sup->supcxerr,"TADS",0x1f9);
    }
    p_Var2 = psVar7->supbifn;
    supaddsym(tab,psVar7->supbinam,6,(int)uVar10,casefold);
    bif[uVar10] = p_Var2;
    uVar10 = uVar10 + 1;
  }
  bVar4 = false;
  piVar9 = &supkwtab[0].supkwtok;
  while( true ) {
    pcVar11 = ((supkwdef *)(piVar9 + -2))->supkwnam;
    if (pcVar11 == (char *)0x0) break;
    if (*pcVar11 == '\x02') {
      if (v1compat != 0) break;
    }
    else {
      __src = pcVar11;
      if (bVar4) {
        __src = new_do;
      }
      if (new_do == (char *)0x0) {
        __src = pcVar11;
      }
      bVar4 = true;
      if (*pcVar11 != '\x01') {
        pcVar11 = __src;
        if (casefold != 0) {
          pcVar11 = buf;
          strcpy(pcVar11,__src);
          os_strlwr(pcVar11);
        }
        p_Var3 = tab->toktfadd;
        sVar6 = strlen(pcVar11);
        iVar1 = *piVar9;
        uVar5 = tokhsh(pcVar11);
        (*p_Var3)(tab,pcVar11,(int)sVar6,0xb,iVar1,uVar5);
        bVar4 = false;
      }
    }
    piVar9 = piVar9 + 4;
  }
  supaddsym(tab,"self",5,0,casefold);
  supaddsym(tab,"inherited",9,0,casefold);
  supaddsym(tab,"argcount",0xd,0,casefold);
  for (psVar12 = supprtab; psVar12->supprnam != (char *)0x0; psVar12 = psVar12 + 1) {
    supaddsym(tab,psVar12->supprnam,3,(uint)psVar12->supprval,casefold);
  }
  return;
}

Assistant:

void suprsrv(supcxdef *sup, void (*bif[])(bifcxdef *, int),
             toktdef *tab, int max, int v1compat, char *new_do,
             int casefold)
{
    supkwdef *kw;
    supbidef *p;
    int       i;
    supprdef *pr;
    extern    supbidef osfar_t supbitab[];
    int       do_kw = FALSE;
    char     *kwname;
    char      buf[40];

    /* add built-in functions */
    for (p = supbitab, i = 0 ; p->supbinam ; ++i, ++p)
    {
        if (i >= max) errsig(sup->supcxerr, ERR_MANYBIF);
        supaddbi(bif, tab, p->supbinam, p->supbifn, i, casefold);
    }

    /* add keywords */
    for (kw = supkwtab ; kw->supkwnam ; ++kw)
    {
        if (kw->supkwnam[0] == '\002')
        {
            if (v1compat) break;               /* no v2 keywords - quit now */
            else continue;          /* keep going, but skip this flag entry */
        }
        
        /* if this is the "do" keyword, change to user-supplied value */
        if (do_kw && new_do)
            kwname = new_do;
        else
            kwname = kw->supkwnam;
        
        if (kw->supkwnam[0] == '\001')
        {
            do_kw = TRUE;
            continue;
        }
        else
            do_kw = FALSE;

        if (casefold)
        {
            strcpy(buf, kwname);
            os_strlwr(buf);
            kwname = buf;
        }
        (*tab->toktfadd)(tab, kwname, (int)strlen(kwname),
                         TOKSTKW, kw->supkwtok, tokhsh(kwname));
    }

    /* add pseudo-variables */
    supaddsym(tab, "self", TOKSTSELF, 0, casefold);
    supaddsym(tab, "inherited", TOKSTINHERIT, 0, casefold);
    supaddsym(tab, "argcount", TOKSTARGC, 0, casefold);
    
    /* add built-in properties */
    for (pr = supprtab ; pr->supprnam ; ++pr)
        supaddsym(tab, pr->supprnam, TOKSTPROP, pr->supprval, casefold);
}